

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Error asmjit::v1_14::JitAllocatorImpl_newBlock
                (JitAllocatorPrivateImpl *impl,JitAllocatorBlock **dst,JitAllocatorPool *pool,
                size_t blockSize)

{
  DualMapping mapping;
  bool bVar1;
  Error EVar2;
  size_t sVar3;
  ulong uVar4;
  void *blockSize_00;
  ulong in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  JitAllocatorOptions *in_RDI;
  BitWord *bitWords;
  ProtectJitReadWriteScope scope;
  uint8_t *blockPtr;
  uint32_t numBitWords;
  uint32_t areaSize;
  Error _err_1;
  Error err;
  size_t largeBlockSize;
  bool tryLargePage;
  size_t largePageSize;
  bool allocateRegularPages;
  Error _err;
  MemoryFlags memFlags;
  DualMapping virtMem;
  uint32_t blockFlags;
  size_t in_stack_fffffffffffffed8;
  ProtectJitReadWriteScope *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef4;
  undefined8 in_stack_fffffffffffffef8;
  uint32_t pattern;
  void *in_stack_ffffffffffffff00;
  void *pvVar5;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  void *local_d0;
  long local_c8;
  BitWord *in_stack_ffffffffffffff40;
  BitWord *in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff50;
  bool local_71;
  void *local_68;
  void *local_60;
  uint local_54;
  ulong local_50;
  long local_48;
  undefined8 *local_40;
  JitAllocatorOptions *local_38;
  Error local_2c;
  void **local_28;
  undefined8 local_20;
  size_t local_18;
  ulong local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  pattern = (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_54 = 0;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                    (*in_RDI,kDisableInitialPadding);
  if (!bVar1) {
    local_54 = local_54 | 1;
  }
  memset(&local_68,0,0x10);
  bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                    (*local_38,kUseDualMapping);
  if (bVar1) {
    EVar2 = VirtMem::allocDualMapping
                      ((DualMapping *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (size_t)in_stack_fffffffffffffee0,
                       (MemoryFlags)(in_stack_fffffffffffffed8 >> 0x20));
    if (EVar2 != 0) {
      return EVar2;
    }
    local_54 = local_54 | 0x10;
  }
  else {
    local_71 = true;
    bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                      (*local_38,kUseLargePages);
    if (bVar1) {
      sVar3 = VirtMem::largePageSize();
      in_stack_ffffffffffffff0f = true;
      if (local_50 < sVar3) {
        in_stack_ffffffffffffff0f =
             Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                       (*local_38,kAlignBlockSizeToLargePage);
      }
      if ((sVar3 != 0) && ((bool)in_stack_ffffffffffffff0f != false)) {
        local_10 = local_50;
        uVar4 = local_50 + (sVar3 - 1);
        local_4 = 7;
        local_8 = 0x200;
        local_18 = sVar3;
        EVar2 = VirtMem::alloc(&in_stack_fffffffffffffee0->_rxPtr,in_stack_fffffffffffffed8,kNone);
        if (EVar2 == 0) {
          local_54 = local_54 | 8;
          local_50 = uVar4 & (sVar3 - 1 ^ 0xffffffffffffffff);
        }
        local_71 = EVar2 != 0;
      }
    }
    if ((local_71) &&
       (EVar2 = VirtMem::alloc(&in_stack_fffffffffffffee0->_rxPtr,in_stack_fffffffffffffed8,kNone),
       EVar2 != 0)) {
      return EVar2;
    }
    local_60 = local_68;
  }
  blockSize_00 = malloc((ulong)((int)((local_50 + *(ushort *)(local_48 + 0x1c)) - 1 >>
                                     (*(byte *)(local_48 + 0x1e) & 0x3f)) + 0x3fU >> 6) * 0x10 +
                        0x68);
  if (blockSize_00 == (void *)0x0) {
    bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                      (*local_38,kUseDualMapping);
    if (bVar1) {
      VirtMem::releaseDualMapping
                ((DualMapping *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    else {
      VirtMem::release(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    local_2c = DebugUtils::errored(1);
  }
  else {
    bVar1 = Support::test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                      (*local_38,kFillUnusedMemory);
    if (bVar1) {
      VirtMem::ProtectJitReadWriteScope::ProtectJitReadWriteScope
                ((ProtectJitReadWriteScope *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (size_t)in_stack_fffffffffffffee0,(CachePolicy)(in_stack_fffffffffffffed8 >> 0x20))
      ;
      JitAllocatorImpl_fillPattern
                (in_stack_ffffffffffffff00,pattern,
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(in_stack_fffffffffffffee0);
    }
    local_c8 = (long)blockSize_00 + 0x68;
    local_20 = 0x68;
    local_28 = &local_d0;
    pvVar5 = (void *)0x0;
    if (blockSize_00 != (void *)0x0) {
      mapping.rw = local_60;
      mapping.rx = local_68;
      local_d0 = blockSize_00;
      JitAllocatorBlock::JitAllocatorBlock
                ((JitAllocatorBlock *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                 (JitAllocatorPool *)0x0,mapping,(size_t)blockSize_00,in_stack_fffffffffffffef4,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
      pvVar5 = blockSize_00;
    }
    *local_40 = pvVar5;
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

static Error JitAllocatorImpl_newBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock** dst, JitAllocatorPool* pool, size_t blockSize) noexcept {
  using Support::BitWord;
  using Support::kBitWordSizeInBits;

  uint32_t blockFlags = 0;
  if (!Support::test(impl->options, JitAllocatorOptions::kDisableInitialPadding))
    blockFlags |= JitAllocatorBlock::kFlagInitialPadding;

  VirtMem::DualMapping virtMem {};
  VirtMem::MemoryFlags memFlags = VirtMem::MemoryFlags::kAccessRWX;

  if (Support::test(impl->options, JitAllocatorOptions::kUseDualMapping)) {
    ASMJIT_PROPAGATE(VirtMem::allocDualMapping(&virtMem, blockSize, memFlags));
    blockFlags |= JitAllocatorBlock::kFlagDualMapped;
  }
  else {
    bool allocateRegularPages = true;
    if (Support::test(impl->options, JitAllocatorOptions::kUseLargePages)) {
      size_t largePageSize = VirtMem::largePageSize();
      bool tryLargePage = blockSize >= largePageSize || Support::test(impl->options, JitAllocatorOptions::kAlignBlockSizeToLargePage);

      // Only proceed if we can actually allocate large pages.
      if (largePageSize && tryLargePage) {
        size_t largeBlockSize = Support::alignUp(blockSize, largePageSize);
        Error err = VirtMem::alloc(&virtMem.rx, largeBlockSize, memFlags | VirtMem::MemoryFlags::kMMapLargePages);

        // Fallback to regular pages if large page(s) allocation failed.
        if (err == kErrorOk) {
          allocateRegularPages = false;
          blockSize = largeBlockSize;
          blockFlags |= JitAllocatorBlock::kFlagLargePages;
        }
      }
    }

    // Called either if large pages were not requested or large page(s) allocation failed.
    if (allocateRegularPages) {
      ASMJIT_PROPAGATE(VirtMem::alloc(&virtMem.rx, blockSize, memFlags));
    }

    virtMem.rw = virtMem.rx;
  }

  uint32_t areaSize = uint32_t((blockSize + pool->granularity - 1) >> pool->granularityLog2);
  uint32_t numBitWords = (areaSize + kBitWordSizeInBits - 1u) / kBitWordSizeInBits;
  uint8_t* blockPtr = static_cast<uint8_t*>(::malloc(sizeof(JitAllocatorBlock) + size_t(numBitWords) * 2u * sizeof(BitWord)));

  // Out of memory...
  if (ASMJIT_UNLIKELY(blockPtr == nullptr)) {
    if (Support::test(impl->options, JitAllocatorOptions::kUseDualMapping))
      VirtMem::releaseDualMapping(&virtMem, blockSize);
    else
      VirtMem::release(virtMem.rx, blockSize);
    return DebugUtils::errored(kErrorOutOfMemory);
  }

  // Fill the allocated virtual memory if secure mode is enabled.
  if (Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    VirtMem::ProtectJitReadWriteScope scope(virtMem.rw, blockSize);
    JitAllocatorImpl_fillPattern(virtMem.rw, impl->fillPattern, blockSize);
  }

  BitWord* bitWords = reinterpret_cast<BitWord*>(blockPtr + sizeof(JitAllocatorBlock));
  *dst = new(Support::PlacementNew{blockPtr}) JitAllocatorBlock(pool, virtMem, blockSize, blockFlags, bitWords, bitWords + numBitWords, areaSize);
  return kErrorOk;
}